

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  size_t *psVar1;
  char *pcVar2;
  string_view filename;
  string local_e8;
  undefined1 local_c8 [32];
  AlphaNum local_a8;
  AlphaNum local_78;
  size_type local_48;
  pointer local_40;
  
  local_78.piece_ = absl::lts_20240722::NullSafeStringView("_");
  pcVar2 = (char *)**(undefined8 **)(descriptor + 8);
  local_a8.piece_._M_str = pcVar2;
  local_a8.piece_._M_len = (*(undefined8 **)(descriptor + 8))[1];
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78);
  absl::lts_20240722::AsciiStrToUpper((string *)__return_storage_ptr__);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    psVar1 = *(size_t **)(*(FileDescriptor **)(descriptor + 0x10) + 8);
    filename._M_str = pcVar2;
    filename._M_len = *psVar1;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_(&local_e8,(void *)psVar1[1],filename);
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView(".");
    local_40 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_48 = __return_storage_ptr__->_M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c8,&local_78,&local_a8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  std::string name = absl::StrCat("_", descriptor.name());
  absl::AsciiStrToUpper(&name);
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}